

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O3

SNMP_ERROR_STATUS __thiscall
IntegerCallback::setTypeWithValue(IntegerCallback *this,BER_CONTAINER *rawValue)

{
  if (this->value != (int *)0x0) {
    *this->value = *(int *)&rawValue[1]._vptr_BER_CONTAINER;
    return NO_ERROR;
  }
  return GEN_ERR;
}

Assistant:

SNMP_ERROR_STATUS IntegerCallback::setTypeWithValue(BER_CONTAINER* rawValue){
    ASSERT_CALLBACK_SETTABLE();
    ASSERT_VALID_SETTABLE_VALUE(this->value);

    IntegerType* val = static_cast<IntegerType*>(rawValue);
    if(this->modifier){
        // Apple local division if callback was asked to
        // val->_value /= this->modifier;
    }
    *this->value = val->_value;

    return NO_ERROR;
}